

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_photogrammetry.cpp
# Opt level: O0

void __thiscall ON_AerialPhotoCameraPosition::UnsetOrientation(ON_AerialPhotoCameraPosition *this)

{
  ON_AerialPhotoCameraPosition *this_local;
  
  this->m_status = this->m_status & 0xfd;
  ON_3dVector::Set(&this->m_orientation_angles_radians,-1.23432101234321e+308,-1.23432101234321e+308
                   ,-1.23432101234321e+308);
  ON_3dVector::Set(&this->m_orientation_angles_degrees,-1.23432101234321e+308,-1.23432101234321e+308
                   ,-1.23432101234321e+308);
  memcpy(&this->m_orientation_rotation,&ON_Xform::Zero4x4,0x80);
  (this->m_orientation_right).x = ON_3dVector::ZeroVector.x;
  (this->m_orientation_right).y = ON_3dVector::ZeroVector.y;
  (this->m_orientation_right).z = ON_3dVector::ZeroVector.z;
  (this->m_orientation_up).x = ON_3dVector::ZeroVector.x;
  (this->m_orientation_up).y = ON_3dVector::ZeroVector.y;
  (this->m_orientation_up).z = ON_3dVector::ZeroVector.z;
  (this->m_orientation_direction).x = ON_3dVector::ZeroVector.x;
  (this->m_orientation_direction).y = ON_3dVector::ZeroVector.y;
  (this->m_orientation_direction).z = ON_3dVector::ZeroVector.z;
  return;
}

Assistant:

void ON_AerialPhotoCameraPosition::UnsetOrientation()
{
  m_status &= 0xFD; // clear bit 2

  m_orientation_angles_radians.Set(ON_UNSET_VALUE,ON_UNSET_VALUE,ON_UNSET_VALUE);
  m_orientation_angles_degrees.Set(ON_UNSET_VALUE,ON_UNSET_VALUE,ON_UNSET_VALUE);

  m_orientation_rotation = ON_Xform::Zero4x4;

  m_orientation_right = ON_3dVector::ZeroVector;
  m_orientation_up = ON_3dVector::ZeroVector;
  m_orientation_direction = ON_3dVector::ZeroVector;
}